

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O3

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,short n)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  StringBuffer *pSVar4;
  char *pcVar5;
  char *__n;
  ulong in_RDX;
  char *pcVar6;
  short sVar7;
  uint uVar8;
  bool bVar9;
  char fbuf [64];
  char local_48;
  char local_47 [71];
  
  uVar8 = (uint)(ushort)n;
  pcVar5 = &local_48;
  pcVar3 = &local_48;
  if (n < 0) {
    pcVar5 = local_47;
    local_48 = '-';
    uVar8 = -(uint)(ushort)n;
    pcVar6 = pcVar5;
  }
  else {
    pcVar6 = &local_48;
    if (n == 0) {
      pcVar5 = local_47;
      local_48 = '0';
      goto LAB_0012dcc0;
    }
  }
  do {
    pcVar3 = pcVar6;
    sVar7 = (short)uVar8;
    uVar2 = (int)sVar7 / 10;
    in_RDX = (ulong)uVar2;
    *pcVar5 = (char)uVar8 + (char)uVar2 * -10 + '0';
    pcVar5 = pcVar5 + 1;
    uVar8 = uVar2;
    pcVar6 = pcVar3;
  } while (0x12 < (ushort)(sVar7 + 9U));
LAB_0012dcc0:
  *pcVar5 = '\0';
  pcVar6 = (char *)CONCAT71((int7)(in_RDX >> 8),pcVar3 != pcVar5);
  __n = pcVar5 + -1;
  if (pcVar3 < __n && pcVar3 != pcVar5) {
    pcVar5 = pcVar3 + 1;
    do {
      cVar1 = pcVar5[-1];
      pcVar5[-1] = *__n;
      *__n = cVar1;
      __n = __n + -1;
      pcVar6 = pcVar5 + 1;
      bVar9 = pcVar5 < __n;
      pcVar5 = pcVar6;
    } while (bVar9);
  }
  pSVar4 = (StringBuffer *)write(this,(int)&local_48,pcVar6,(size_t)__n);
  return pSVar4;
}

Assistant:

StringBuffer& operator<<(short int n)          { _ITOA(n); }